

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

int Pm_Read(PortMidiStream *stream,PmEvent *buffer,int32_t length)

{
  PmError PVar1;
  PmError local_38;
  PmError err_1;
  PmError err;
  int n;
  PmInternal *midi;
  PmEvent *pPStack_20;
  int32_t length_local;
  PmEvent *buffer_local;
  PortMidiStream *stream_local;
  
  err_1 = pmNoData;
  pm_hosterror = 0;
  if (stream == (PortMidiStream *)0x0) {
    local_38 = pmBadPtr;
  }
  else if (descriptors[*stream].pub.opened == 0) {
    local_38 = pmBadPtr;
  }
  else if (descriptors[*stream].pub.input == 0) {
    local_38 = pmBadPtr;
  }
  else {
    local_38 = (**(code **)(*(long *)((long)stream + 0x50) + 0x50))(stream);
  }
  pPStack_20 = buffer;
  if (local_38 == pmNoData) {
    for (; err_1 < length; err_1 = err_1 + pmGotData) {
      PVar1 = Pm_Dequeue(*(PmQueue **)((long)stream + 0x20),pPStack_20);
      if (PVar1 == pmBufferOverflow) {
        return -0x270c;
      }
      if (PVar1 == pmNoData) break;
      pPStack_20 = pPStack_20 + 1;
    }
    stream_local._4_4_ = err_1;
  }
  else {
    if (local_38 == pmHostError) {
      (**(code **)(*(long *)((long)stream + 0x50) + 0x60))(stream,pm_hosterror_text,0x100);
      pm_hosterror = 1;
    }
    stream_local._4_4_ = local_38;
  }
  return stream_local._4_4_;
}

Assistant:

PMEXPORT int Pm_Read(PortMidiStream *stream, PmEvent *buffer, int32_t length) {
    PmInternal *midi = (PmInternal *) stream;
    int n = 0;
    PmError err = pmNoError;
    pm_hosterror = FALSE;
    /* arg checking */
    if(midi == NULL)
        err = pmBadPtr;
    else if(!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    else if(!descriptors[midi->device_id].pub.input)
        err = pmBadPtr;    
    /* First poll for data in the buffer...
     * This either simply checks for data, or attempts first to fill the buffer
     * with data from the MIDI hardware; this depends on the implementation.
     * We could call Pm_Poll here, but that would redo a lot of redundant
     * parameter checking, so I copied some code from Pm_Poll to here: */
    else err = (*(midi->dictionary->poll))(midi);

    if (err != pmNoError) {
        if (err == pmHostError) {
            midi->dictionary->host_error(midi, pm_hosterror_text, 
                                         PM_HOST_ERROR_MSG_LEN);
          pm_hosterror = TRUE;
        }
        return pm_errmsg(err);
    }

    while (n < length) {
        PmError err = Pm_Dequeue(midi->queue, buffer++);
        if (err == pmBufferOverflow) {
            /* ignore the data we have retreived so far */
            return pm_errmsg(pmBufferOverflow);
        } else if (err == 0) { /* empty queue */
            break;
        }
        n++;
    }
    return n;
}